

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::Reader::readString(Reader *this)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar3 = this->end_;
  pcVar4 = this->current_;
  if (pcVar4 == pcVar3) {
    return false;
  }
  do {
    pcVar1 = pcVar4 + 1;
    this->current_ = pcVar1;
    cVar2 = *pcVar4;
    if (cVar2 == '\\') {
      if (pcVar1 != pcVar3) {
        this->current_ = pcVar4 + 2;
        pcVar1 = pcVar4 + 2;
      }
    }
    else if (cVar2 == '\"') break;
    pcVar4 = pcVar1;
  } while (pcVar4 != pcVar3);
  return cVar2 == '\"';
}

Assistant:

bool Reader::readString() {
  Char c = '\0';
  while (current_ != end_) {
    c = getNextChar();
    if (c == '\\')
      getNextChar();
    else if (c == '"')
      break;
  }
  return c == '"';
}